

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O3

ByteData * __thiscall
cfd::SignParameter::ConvertToSignature(ByteData *__return_storage_ptr__,SignParameter *this)

{
  pointer puVar1;
  char cVar2;
  CfdException *this_00;
  undefined1 local_68 [32];
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  cfd::core::ByteData::ByteData(__return_storage_ptr__);
  if (this->der_encode_ == true) {
    cVar2 = cfd::core::ByteData::Empty();
    if (cVar2 != '\0') {
      local_68._0_8_ = "cfd_transaction_common.cpp";
      local_68._8_4_ = 0x1d6;
      local_68._16_8_ = "ConvertToSignature";
      core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
                          "Failed to ConvertToSignature. sign hex empty.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._0_8_ = local_68 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Invalid hex string. empty sign data.","");
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_68);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_();
    cfd::core::CryptoUtil::ConvertSignatureToDer((string *)&local_48,(SigHashType *)local_68);
    puVar1 = (__return_storage_ptr__->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    (__return_storage_ptr__->data_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (pointer)0x0;
    puStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48);
      }
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&__return_storage_ptr__->data_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData SignParameter::ConvertToSignature() const {
  ByteData byte_data;
  if (der_encode_) {
    if (data_.Empty()) {
      warn(CFD_LOG_SOURCE, "Failed to ConvertToSignature. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign data.");
    }
    byte_data =
        CryptoUtil::ConvertSignatureToDer(data_.GetHex(), sighash_type_);
  } else {
    byte_data = data_;
  }
  return byte_data;
}